

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_mtree.c
# Opt level: O0

int write_mtree_entry_tree(archive_write *a)

{
  long lVar1;
  int iVar2;
  mtree_entry_conflict *pmVar3;
  mtree_entry_conflict *pmVar4;
  archive *in_RDI;
  mtree_writer *unaff_retaddr;
  mtree_entry_conflict *e_1;
  mtree_entry_conflict *e;
  int ret;
  archive_rb_node *n;
  mtree_entry_conflict *np;
  mtree_writer *mtree;
  mtree_entry_conflict *in_stack_ffffffffffffffc0;
  mtree_entry_conflict *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  mtree_entry_conflict *in_stack_ffffffffffffffd8;
  mtree_entry_conflict *parent;
  
  lVar1 = *(long *)&in_RDI[1].current_codepage;
  parent = *(mtree_entry_conflict **)(lVar1 + 8);
  do {
    if (*(int *)(lVar1 + 0xfc) != 0) {
      attr_counter_set_free((mtree_writer *)in_stack_ffffffffffffffc0);
      pmVar3 = (mtree_entry_conflict *)
               __archive_rb_tree_iterate(&parent->dir_info->rbtree,(archive_rb_node *)0x0,0);
      while (pmVar3 != (mtree_entry_conflict *)0x0) {
        pmVar4 = pmVar3;
        iVar2 = attr_counter_set_collect
                          ((mtree_writer *)pmVar3,
                           (mtree_entry_conflict *)
                           CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
        if (iVar2 < 0) {
          archive_set_error(in_RDI,0xc,"Can\'t allocate memory");
          return -0x1e;
        }
        pmVar4 = (mtree_entry_conflict *)
                 __archive_rb_tree_iterate(&parent->dir_info->rbtree,&pmVar4->rbnode,1);
        in_stack_ffffffffffffffc8 = pmVar3;
        pmVar3 = pmVar4;
      }
      in_stack_ffffffffffffffd8 = (mtree_entry_conflict *)0x0;
    }
    if ((parent->dir_info->virtual == 0) || (*(int *)(lVar1 + 0xd8) != 0)) {
      iVar2 = write_mtree_entry((archive_write *)parent,in_stack_ffffffffffffffd8);
      if (iVar2 != 0) {
        return -0x1e;
      }
      in_stack_ffffffffffffffd4 = 0;
    }
    else if (*(int *)(lVar1 + 0xfc) != 0) {
      write_global(unaff_retaddr);
    }
    *(int *)(lVar1 + 0xdc) = *(int *)(lVar1 + 0xdc) + 1;
    in_stack_ffffffffffffffd8 =
         (mtree_entry_conflict *)
         __archive_rb_tree_iterate(&parent->dir_info->rbtree,(archive_rb_node *)0x0,0);
    while (in_stack_ffffffffffffffd8 != (mtree_entry_conflict *)0x0) {
      pmVar3 = in_stack_ffffffffffffffd8;
      if (in_stack_ffffffffffffffd8->dir_info == (dir_info *)0x0) {
        iVar2 = write_mtree_entry((archive_write *)parent,in_stack_ffffffffffffffd8);
        if (iVar2 != 0) {
          return -0x1e;
        }
        in_stack_ffffffffffffffd4 = 0;
        in_stack_ffffffffffffffc0 = in_stack_ffffffffffffffd8;
      }
      else {
        mtree_entry_add_child_tail(parent,in_stack_ffffffffffffffd8);
        in_stack_ffffffffffffffc0 = in_stack_ffffffffffffffd8;
      }
      in_stack_ffffffffffffffd8 =
           (mtree_entry_conflict *)
           __archive_rb_tree_iterate(&parent->dir_info->rbtree,&pmVar3->rbnode,1);
    }
    *(int *)(lVar1 + 0xdc) = *(int *)(lVar1 + 0xdc) + -1;
    if ((parent->dir_info->children).first == (mtree_entry_conflict *)0x0) {
      if (*(int *)(lVar1 + 0xd8) != 0) {
        iVar2 = write_dot_dot_entry((archive_write *)
                                    CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                                    in_stack_ffffffffffffffc8);
        if (iVar2 != 0) {
          return -0x1e;
        }
        in_stack_ffffffffffffffd4 = 0;
      }
      for (; parent != parent->parent; parent = parent->parent) {
        if (parent->dir_info->chnext != (mtree_entry_conflict *)0x0) {
          parent = parent->dir_info->chnext;
          break;
        }
        if (*(int *)(lVar1 + 0xf8) != 0) {
          *(int *)(lVar1 + 0xdc) = *(int *)(lVar1 + 0xdc) + -1;
        }
        if (*(int *)(lVar1 + 0xd8) != 0) {
          iVar2 = write_dot_dot_entry((archive_write *)
                                      CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                                      in_stack_ffffffffffffffc8);
          if (iVar2 != 0) {
            return -0x1e;
          }
          in_stack_ffffffffffffffd4 = 0;
        }
      }
    }
    else {
      parent = (parent->dir_info->children).first;
      if (*(int *)(lVar1 + 0xf8) != 0) {
        *(int *)(lVar1 + 0xdc) = *(int *)(lVar1 + 0xdc) + 1;
      }
    }
    if (parent == parent->parent) {
      return 0;
    }
  } while( true );
}

Assistant:

static int
write_mtree_entry_tree(struct archive_write *a)
{
	struct mtree_writer *mtree = a->format_data;
	struct mtree_entry *np = mtree->root;
	struct archive_rb_node *n;
	int ret;

	do {
		if (mtree->output_global_set) {
			/*
			 * Collect attribute infomation to know which value
			 * is frequently used among the children.
			 */
			attr_counter_set_reset(mtree);
			ARCHIVE_RB_TREE_FOREACH(n, &(np->dir_info->rbtree)) {
				struct mtree_entry *e = (struct mtree_entry *)n;
				if (attr_counter_set_collect(mtree, e) < 0) {
					archive_set_error(&a->archive, ENOMEM,
					    "Can't allocate memory");
					return (ARCHIVE_FATAL);
				}
			}
		}
		if (!np->dir_info->virtual || mtree->classic) {
			ret = write_mtree_entry(a, np);
			if (ret != ARCHIVE_OK)
				return (ARCHIVE_FATAL);
		} else {
			/* Whenever output_global_set is enabled
			 * output global value(/set keywords)
			 * even if the directory entry is not allowed
			 * to be written because the global values
			 * can be used for the children. */
			if (mtree->output_global_set)
				write_global(mtree);
		}
		/*
		 * Output the attribute of all files except directory files.
		 */
		mtree->depth++;
		ARCHIVE_RB_TREE_FOREACH(n, &(np->dir_info->rbtree)) {
			struct mtree_entry *e = (struct mtree_entry *)n;

			if (e->dir_info)
				mtree_entry_add_child_tail(np, e);
			else {
				ret = write_mtree_entry(a, e);
				if (ret != ARCHIVE_OK)
					return (ARCHIVE_FATAL);
			}
		}
		mtree->depth--;

		if (np->dir_info->children.first != NULL) {
			/*
			 * Descend the tree.
			 */
			np = np->dir_info->children.first;
			if (mtree->indent)
				mtree->depth++;
			continue;
		} else if (mtree->classic) {
			/*
			 * While printing mtree classic, if there are not
			 * any directory files(except "." and "..") in the
			 * directory, output two dots ".." as returning
			 * the parent directory.
			 */
			ret = write_dot_dot_entry(a, np);
			if (ret != ARCHIVE_OK)
				return (ARCHIVE_FATAL);
		}

		while (np != np->parent) {
			if (np->dir_info->chnext == NULL) {
				/*
				 * Ascend the tree; go back to the parent.
				 */
				if (mtree->indent)
					mtree->depth--;
				if (mtree->classic) {
					ret = write_dot_dot_entry(a,
						np->parent);
					if (ret != ARCHIVE_OK)
						return (ARCHIVE_FATAL);
				}
				np = np->parent;
			} else {
				/*
				 * Switch to next mtree entry in the directory.
				 */
				np = np->dir_info->chnext;
				break;
			}
		}
	} while (np != np->parent); 

	return (ARCHIVE_OK);
}